

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O0

void OutputDebugStringA(char *pOut)

{
  undefined4 __fd;
  void *__buf;
  size_t __n;
  allocator<char> local_39;
  string local_38 [8];
  string strTmp;
  int fdPipe;
  char *pOut_local;
  
  strTmp.field_2._12_4_ = open("/tmp/dbgout",0x801);
  if (-1 < (int)strTmp.field_2._12_4_) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_38,pOut,&local_39);
    std::allocator<char>::~allocator(&local_39);
    __fd = strTmp.field_2._12_4_;
    __buf = (void *)std::__cxx11::string::c_str();
    __n = std::__cxx11::string::size();
    write(__fd,__buf,__n);
    close(strTmp.field_2._12_4_);
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void OutputDebugStringA(const char* pOut)
{   // mkfifo /tmp/dbgout  ->  tail -f /tmp/dbgout
    int fdPipe = open("/tmp/dbgout", O_WRONLY | O_NONBLOCK);
    if (fdPipe >= 0)
    {
        std::string strTmp(pOut);
        write(fdPipe, strTmp.c_str(), strTmp.size());
        close(fdPipe);
    }
}